

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_net_reader.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  vector<char,_std::allocator<char>_> line;
  shared_ptr<diffusion::Reader> net_reader;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  Reader *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  string local_30;
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12d368);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," writer_ip_address writer_port",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,argv[1],&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,argv[2],&local_62);
  local_40 = diffusion::create_network_reader(&local_60,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<diffusion::Reader*>
            (&local_38,local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  do {
    while( true ) {
      iVar1 = (**local_40->_vptr_Reader)();
      if ((char)iVar1 != '\0') break;
      local_60._M_dataplus._M_p = (pointer)0xa;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_60);
    }
    (*local_40->_vptr_Reader[1])(&local_60);
    std::ostream::write((char *)&std::cout,(long)local_60._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_60._M_dataplus._M_p,
                      local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 3) {
        std::cerr << "Usage: " << argv[0] << " writer_ip_address writer_port" << std::endl;
        return 0;
    }
    auto net_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_network_reader(argv[1], argv[2]));
    while (true) {
        if (net_reader->can_read()) {
            auto line = net_reader->read();
            std::cout.write(line.data(), line.size());
            std::cout << std::endl;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(10));
        }
    }
    return 0;
}